

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall CVmConsole::open_command_log(CVmConsole *this,CVmNetFile *nf,int event_script)

{
  FILE *pFVar1;
  osfildef *fp_00;
  int in_EDX;
  char *in_RSI;
  CVmNetFile *in_RDI;
  osfildef *fp;
  CVmConsole *in_stack_000000b0;
  uint local_4;
  
  close_command_log(in_stack_000000b0);
  if (in_RSI == (char *)0x0) {
    local_4 = 1;
  }
  else {
    pFVar1 = fopen(*(char **)in_RSI,"w");
    if (pFVar1 == (FILE *)0x0) {
      CVmNetFile::abandon(in_RDI);
    }
    else {
      in_RDI[1].lclfname = in_RSI;
      fp_00 = (osfildef *)operator_new(0x10);
      CVmFileSource::CVmFileSource((CVmFileSource *)in_RDI,fp_00);
      in_RDI->mime_type = (char *)fp_00;
    }
    *(byte *)&in_RDI->filespec = (byte)in_RDI->filespec & 0xfb | ((byte)in_EDX & 1) << 2;
    if ((in_EDX != 0) && (in_RDI->mime_type != (char *)0x0)) {
      (**(code **)(*(long *)in_RDI->mime_type + 0x28))(in_RDI->mime_type,"<eventscript>\n");
      (**(code **)(*(long *)in_RDI->mime_type + 0x48))();
    }
    local_4 = (uint)(in_RDI->mime_type == (char *)0x0);
  }
  return local_4;
}

Assistant:

int CVmConsole::open_command_log(VMG_ CVmNetFile *nf, int event_script)
{
    /* close any existing command log file */
    close_command_log(vmg0_);

    /* if the network file open failed, return failure */
    if (nf == 0)
        return 1;
    
    /* open the file */
    osfildef *fp = osfopwt(nf->lclfname, OSFTCMD);
    if (fp != 0)
    {
        /* success - remember the file handle and net descriptor */
        command_nf_ = nf;
        command_fp_ = new CVmFileSource(fp);
    }
    else
    {
        /* failed - abandon the network file */
        nf->abandon(vmg0_);
    }

    /* note the type */
    command_eventscript_ = event_script;

    /* if it's an event script, write the file type tag */
    if (event_script && command_fp_ != 0)
    {
        command_fp_->writez("<eventscript>\n");
        command_fp_->flush();
    }

    /* return success if we successfully opened the file */
    return (command_fp_ == 0);
}